

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_changeCoeff(HModel *this,int row,int col,double newval)

{
  int *piVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n");
  std::ostream::flush();
  lVar7 = (long)col;
  piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)piVar2[lVar7];
  lVar6 = (long)piVar2[lVar7 + 1];
  lVar4 = lVar5 << 0x20;
  do {
    if (lVar6 <= lVar5) {
LAB_001342cc:
      lVar4 = (long)piVar2[this->numCol];
      std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,lVar4 + 1U);
      std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,lVar4 + 1U);
      piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (lVar7 = lVar7 + 1, lVar7 <= this->numCol) {
        piVar1 = piVar2 + lVar7;
        *piVar1 = *piVar1 + 1;
      }
      piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; lVar6 < lVar4; lVar4 = lVar4 + -1) {
        piVar2[lVar4] = piVar2[lVar4 + -1];
        pdVar3[lVar4] = pdVar3[lVar4 + -1];
      }
LAB_001342a4:
      pdVar3[lVar6] = newval;
      mlFg_Update(this,this->mlFg_action_NewRows);
      return;
    }
    if ((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar5] == row) {
      if (-1 < lVar5) {
        pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = lVar4 >> 0x20;
        goto LAB_001342a4;
      }
      goto LAB_001342cc;
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x100000000;
  } while( true );
}

Assistant:

void HModel::util_changeCoeff(int row, int col, const double newval) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n", row, col, newval);cout << flush;
#endif
  //  printf("\n\nCalled model.util_changeCoeff(row=%d, col=%d, newval=%g)\n\n", row, col, newval);cout << flush;

  //  util_reportModel();
  int cg_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
  //    printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);
    if (Aindex[el] == row) {
      cg_el = el;
      break;
    }
  }
  if (cg_el < 0) {
  //    printf("model.util_changeCoeff: Cannot find row %d in column %d\n", row, col);
    cg_el = Astart[col+1];
    int nwNnonz = Astart[numCol] + 1;
    //    printf("model.util_changeCoeff: Increasing Nnonz from %d to %d\n", Astart[numCol], nwNnonz);
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);
    for (int i=col+1; i<=numCol; i++) Astart[i]++;
    for (int el=nwNnonz-1; el>cg_el; el--) {
      Aindex[el] = Aindex[el-1];
      Avalue[el] = Avalue[el-1];
    }
  }    
  Avalue[cg_el] = newval;

  //Deduce the consequences of a changed element
  //ToDo: Can do something more intelligent if element is in nonbasic column. Otherwise, treat it as if 
  mlFg_Update(mlFg_action_NewRows);
  //  util_reportModel();

}